

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::SocketStream::SocketStream(SocketStream *this,string *targetName)

{
  int iVar1;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"tcp",&local_49);
  Stream::Stream((Stream *)&(this->super_DisconnectableStream).field_0x1038,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"tcp",&local_49);
  DisconnectableStream::DisconnectableStream
            (&this->super_DisconnectableStream,&PTR_construction_vtable_24__001264c8,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream =
       (_func_int **)&PTR__SocketStream_00126430;
  *(undefined ***)&(this->super_DisconnectableStream).field_0x1038 = &PTR__SocketStream_00126498;
  ExpandableBuffer::ExpandableBuffer
            ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020,0x100);
  ParameterSet::add((ParameterSet *)
                    (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                    (long)(this->super_DisconnectableStream).super_SelectableStream.
                          _vptr_SelectableStream[-3]),"tcp:host;port;connectionPort=-1;sock=-1");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                    (long)(this->super_DisconnectableStream).super_SelectableStream.
                          _vptr_SelectableStream[-3]),(targetName->_M_dataplus)._M_p);
  iVar1 = getOrCreateSocket((ParameterSet *)
                            (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                            (long)(this->super_DisconnectableStream).super_SelectableStream.
                                  _vptr_SelectableStream[-3]));
  (this->super_DisconnectableStream).super_SelectableStream.fd = iVar1;
  iVar1 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),"sock");
  if (-1 < iVar1) {
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_DisconnectableStream).super_SelectableStream.field_0x30 +
                        (long)(this->super_DisconnectableStream).super_SelectableStream.
                              _vptr_SelectableStream[-3]),"sock");
  }
  return;
}

Assistant:

explicit SocketStream(const string& targetName) :
			Stream("tcp"),
			DisconnectableStream("tcp")
#ifndef TCP_CORK
			,
			sendBuffer(SEND_BUFFER_SIZE_INITIAL)
#endif
		{
			target.add("tcp:host;port;connectionPort=-1;sock=-1");
			target.add(targetName.c_str());

			fd = getOrCreateSocket(target);
			if (target.get<int>("sock") >= 0)
			{
				// remove file descriptor information from target name
				target.erase("sock");
			}

#ifdef TCP_CORK
			// setup TCP Cork for delayed sending
			int flag = 1;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
#endif
		}